

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvoidReinterprets.cpp
# Opt level: O2

void __thiscall wasm::AvoidReinterprets::optimize(AvoidReinterprets *this,Function *func)

{
  _Rb_tree_node_base *__v;
  bool bVar1;
  Index IVar2;
  Memory *pMVar3;
  Type type;
  _Base_ptr p_Var4;
  undefined1 auStack_168 [8];
  FinalOptimizer finalOptimizer;
  set<wasm::Load_*,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_> unoptimizables;
  
  unoptimizables._M_t._M_impl._0_4_ = 0;
  unoptimizables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  unoptimizables._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  unoptimizables._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p_Var4 = (this->infos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  unoptimizables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Rb_tree_node_base *)&unoptimizables;
  unoptimizables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Rb_tree_node_base *)&unoptimizables;
  unoptimizables._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  do {
    if ((_Rb_tree_header *)p_Var4 == &(this->infos)._M_t._M_impl.super__Rb_tree_header) {
      for (p_Var4 = unoptimizables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var4 != (_Rb_tree_node_base *)&unoptimizables;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        auStack_168 = *(undefined1 (*) [8])(p_Var4 + 1);
        std::
        _Rb_tree<wasm::Load_*,_std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>,_std::_Select1st<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
        ::erase(&(this->infos)._M_t,(key_type *)auStack_168);
      }
      finalOptimizer.infos =
           *(map<wasm::Load_*,_wasm::AvoidReinterprets::Info,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
             **)(unoptimizables._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x138);
      finalOptimizer.super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
      super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.currFunction =
           *(Function **)(unoptimizables._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x100);
      finalOptimizer.module =
           (Module *)
           (*(long *)(unoptimizables._M_t._M_impl.super__Rb_tree_header._M_node_count + 8) + 0x30);
      auStack_168 = (undefined1  [8])0x0;
      finalOptimizer.super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
      super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.replacep =
           (Expression **)0x0;
      finalOptimizer.super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
      super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack.fixed._M_elems[9].
      currp = (Expression **)0x0;
      finalOptimizer.super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
      super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task,_std::allocator<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      finalOptimizer.super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
      super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task,_std::allocator<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      finalOptimizer.super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
      super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task,_std::allocator<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      finalOptimizer.super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
      super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.currModule =
           (Module *)&this->infos;
      finalOptimizer.localGraph =
           (LocalGraph *)
           finalOptimizer.super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
           super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.currFunction;
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::walk
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)auStack_168,
                 &func->body);
      std::
      _Vector_base<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task,_std::allocator<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task>_>
      ::~_Vector_base((_Vector_base<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task,_std::allocator<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task>_>
                       *)((long)(finalOptimizer.
                                 super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>
                                 .super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>
                                 .stack.fixed._M_elems + 9) + 8));
      std::
      _Rb_tree<wasm::Load_*,_wasm::Load_*,_std::_Identity<wasm::Load_*>,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_>
      ::~_Rb_tree((_Rb_tree<wasm::Load_*,_wasm::Load_*,_std::_Identity<wasm::Load_*>,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_>
                   *)&finalOptimizer.passOptions);
      return;
    }
    __v = p_Var4 + 1;
    if (*(char *)&p_Var4[1]._M_parent == '\x01') {
      bVar1 = canReplaceWithReinterpret(*(Load **)__v);
      if (!bVar1) goto LAB_007e82b3;
      pMVar3 = Module::getMemory(*(Module **)
                                  (unoptimizables._M_t._M_impl.super__Rb_tree_header._M_node_count +
                                  0x100),(Name)((*(Load **)__v)->memory).super_IString.str);
      IVar2 = Builder::addVar(func,(Type)(pMVar3->indexType).id);
      *(Index *)((long)&p_Var4[1]._M_parent + 4) = IVar2;
      type = wasm::Type::reinterpret((Type *)(*(long *)(p_Var4 + 1) + 8));
      IVar2 = Builder::addVar(func,type);
      *(Index *)&p_Var4[1]._M_left = IVar2;
    }
    else {
LAB_007e82b3:
      std::
      _Rb_tree<wasm::Load*,wasm::Load*,std::_Identity<wasm::Load*>,std::less<wasm::Load*>,std::allocator<wasm::Load*>>
      ::_M_insert_unique<wasm::Load*const&>
                ((_Rb_tree<wasm::Load*,wasm::Load*,std::_Identity<wasm::Load*>,std::less<wasm::Load*>,std::allocator<wasm::Load*>>
                  *)&finalOptimizer.passOptions,(Load **)__v);
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

void optimize(Function* func) {
    std::set<Load*> unoptimizables;
    for (auto& [load, info] : infos) {
      if (info.reinterpreted && canReplaceWithReinterpret(load)) {
        // We should use another load here, to avoid reinterprets.
        auto mem = getModule()->getMemory(load->memory);
        info.ptrLocal = Builder::addVar(func, mem->indexType);
        info.reinterpretedLocal =
          Builder::addVar(func, load->type.reinterpret());
      } else {
        unoptimizables.insert(load);
      }
    }
    for (auto* load : unoptimizables) {
      infos.erase(load);
    }
    // We now know which we can optimize, and how.
    struct FinalOptimizer : public PostWalker<FinalOptimizer> {
      std::map<Load*, Info>& infos;
      LocalGraph* localGraph;
      Module* module;
      const PassOptions& passOptions;

      FinalOptimizer(std::map<Load*, Info>& infos,
                     LocalGraph* localGraph,
                     Module* module,
                     const PassOptions& passOptions)
        : infos(infos), localGraph(localGraph), module(module),
          passOptions(passOptions) {}

      void visitUnary(Unary* curr) {
        if (isReinterpret(curr)) {
          auto* value = curr->value;
          if (auto* load = value->dynCast<Load>()) {
            // A reinterpret of a load - flip it right here if we can.
            if (canReplaceWithReinterpret(load)) {
              replaceCurrent(makeReinterpretedLoad(load, load->ptr));
            }
          } else if (auto* get = value->dynCast<LocalGet>()) {
            if (auto* load =
                  getSingleLoad(localGraph, get, passOptions, *module)) {
              auto iter = infos.find(load);
              if (iter != infos.end()) {
                auto& info = iter->second;
                // A reinterpret of a get of a load - use the new local.
                Builder builder(*module);
                replaceCurrent(builder.makeLocalGet(info.reinterpretedLocal,
                                                    load->type.reinterpret()));
              }
            }
          }
        }
      }

      void visitLoad(Load* curr) {
        auto iter = infos.find(curr);
        if (iter != infos.end()) {
          auto& info = iter->second;
          Builder builder(*module);
          auto* ptr = curr->ptr;
          auto mem = getModule()->getMemory(curr->memory);
          auto indexType = mem->indexType;
          curr->ptr = builder.makeLocalGet(info.ptrLocal, indexType);
          // Note that the other load can have its sign set to false - if the
          // original were an integer, the other is a float anyhow; and if
          // original were a float, we don't know what sign to use.
          replaceCurrent(builder.makeBlock(
            {builder.makeLocalSet(info.ptrLocal, ptr),
             builder.makeLocalSet(
               info.reinterpretedLocal,
               makeReinterpretedLoad(
                 curr, builder.makeLocalGet(info.ptrLocal, indexType))),
             curr}));
        }
      }

      Load* makeReinterpretedLoad(Load* load, Expression* ptr) {
        Builder builder(*module);
        return builder.makeLoad(load->bytes,
                                false,
                                load->offset,
                                load->align,
                                ptr,
                                load->type.reinterpret(),
                                load->memory);
      }
    } finalOptimizer(infos, localGraph, getModule(), getPassOptions());

    finalOptimizer.setModule(getModule());
    finalOptimizer.walk(func->body);
  }